

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O2

void ssh2_terminal_size(ConnectionLayer *cl,int width,int height)

{
  LogContext *pLVar1;
  
  *(int *)((long)&cl[-0xb].vt + 4) = width;
  *(int *)&cl[-10].logctx = height;
  pLVar1 = cl[-0xc].logctx;
  if (pLVar1 == (LogContext *)0x0) {
    return;
  }
  *(int *)((long)&pLVar1->currlogfilename + 4) = width;
  *(int *)&pLVar1->lp = height;
  if ((*(char *)((long)&(pLVar1->queue).buffersize + 7) == '\0') &&
     (*(char *)((long)&pLVar1->currlogfilename + 2) != '\x01')) {
    return;
  }
  (**(code **)(*(long *)pLVar1->lgfp + 0x98))();
  return;
}

Assistant:

static void ssh2_terminal_size(ConnectionLayer *cl, int width, int height)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);

    s->term_width = width;
    s->term_height = height;
    if (s->mainchan)
        mainchan_terminal_size(s->mainchan, width, height);
}